

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::EventTriggerStatementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,EventTriggerStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *node;
  SyntaxNode *local_60;
  size_t index_local;
  EventTriggerStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    TokenOrSyntax::TokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_60 = (SyntaxNode *)0x0;
    if (this != (EventTriggerStatementSyntax *)0xffffffffffffffe8) {
      local_60 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 2:
    token.kind = (this->trigger).kind;
    token._2_1_ = (this->trigger).field_0x2;
    token.numFlags.raw = (this->trigger).numFlags.raw;
    token.rawLen = (this->trigger).rawLen;
    token.info = (this->trigger).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->timing->super_SyntaxNode);
    break;
  case 4:
    node = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->name);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 5:
    token_00.kind = (this->semi).kind;
    token_00._2_1_ = (this->semi).field_0x2;
    token_00.numFlags.raw = (this->semi).numFlags.raw;
    token_00.rawLen = (this->semi).rawLen;
    token_00.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax EventTriggerStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return trigger;
        case 3: return timing;
        case 4: return name.get();
        case 5: return semi;
        default: return nullptr;
    }
}